

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

Llb_Mnx_t * Llb_MnxStart(Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  Llb_Mnx_t *pLVar1;
  abctime aVar2;
  long lVar3;
  ulong uVar4;
  DdManager *unique;
  Vec_Int_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  int iVar8;
  
  pLVar1 = (Llb_Mnx_t *)calloc(1,0x80);
  pLVar1->pAig = pAig;
  pLVar1->pPars = pPars;
  iVar8 = pPars->TimeLimit;
  if ((long)iVar8 == 0) {
    lVar3 = 0;
  }
  else {
    aVar2 = Abc_Clock();
    lVar3 = aVar2 + (long)iVar8 * 1000000;
  }
  pPars->TimeTarget = lVar3;
  if (pPars->fCluster == 0) {
    pVVar5 = Llb_Nonlin4CreateOrder(pAig);
    pLVar1->vOrder = pVVar5;
    uVar7 = 0;
    uVar4 = (ulong)(uint)pVVar5->nSize;
    if (pVVar5->nSize < 1) {
      uVar4 = uVar7;
    }
    iVar8 = 0;
    for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      iVar8 = iVar8 + (uint)(0 < pVVar5->pArray[uVar7]);
    }
    unique = Cudd_Init(iVar8 + 1,0,0x100,0x40000,0);
    pLVar1->dd = unique;
    Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
    Cudd_SetMaxGrowth(unique,1.05);
    unique->TimeStop = pPars->TimeTarget;
    pVVar6 = Llb_Nonlin4DerivePartitions(unique,pAig,pVVar5);
    pLVar1->vRoots = pVVar6;
  }
  else {
    Llb4_Nonlin4Sweep(pAig,pPars->nBddMax,pPars->nClusterMax,&pLVar1->dd,&pLVar1->vOrder,
                      &pLVar1->vRoots,pPars->fVerbose);
    unique = pLVar1->dd;
    unique->TimeStop = pLVar1->pPars->TimeTarget;
    pVVar5 = pLVar1->vOrder;
  }
  Llb_Nonlin4SetupVarMap(unique,pAig,pVVar5);
  pVVar5 = Llb_Nonlin4CreateVars2Q(pLVar1->dd,pAig,pLVar1->vOrder,pLVar1->pPars->fBackward);
  pLVar1->vVars2Q = pVVar5;
  pVVar6 = Vec_PtrAlloc(100);
  pLVar1->vRings = pVVar6;
  if (pPars->fReorder != 0) {
    Llb_Nonlin4Reorder(pLVar1->dd,0,1);
  }
  return pLVar1;
}

Assistant:

Llb_Mnx_t * Llb_MnxStart( Aig_Man_t * pAig, Gia_ParLlb_t * pPars )
{
    Llb_Mnx_t * p;

    p = ABC_CALLOC( Llb_Mnx_t, 1 );
    p->pAig    = pAig;
    p->pPars   = pPars;

    // compute time to stop
    p->pPars->TimeTarget = p->pPars->TimeLimit ? p->pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;

    if ( pPars->fCluster )
    {
//        Llb_Nonlin4Cluster( p->pAig, &p->dd, &p->vOrder, &p->vRoots, pPars->nBddMax, pPars->fVerbose );
//        Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
        Llb4_Nonlin4Sweep( p->pAig, pPars->nBddMax, pPars->nClusterMax, &p->dd, &p->vOrder, &p->vRoots, pPars->fVerbose );
		// set the stop time parameter
		p->dd->TimeStop  = p->pPars->TimeTarget;
    }
    else
    {
//    p->vOrder  = Llb_Nonlin4CreateOrderSimple( pAig );
        p->vOrder  = Llb_Nonlin4CreateOrder( pAig );
        p->dd      = Cudd_Init( Vec_IntCountPositive(p->vOrder) + 1, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
        Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
        Cudd_SetMaxGrowth( p->dd, 1.05 );
		// set the stop time parameter
		p->dd->TimeStop  = p->pPars->TimeTarget;
        p->vRoots  = Llb_Nonlin4DerivePartitions( p->dd, pAig, p->vOrder );
    }

    Llb_Nonlin4SetupVarMap( p->dd, pAig, p->vOrder );
    p->vVars2Q = Llb_Nonlin4CreateVars2Q( p->dd, pAig, p->vOrder, p->pPars->fBackward );
    p->vRings  = Vec_PtrAlloc( 100 );

    if ( pPars->fReorder )
        Llb_Nonlin4Reorder( p->dd, 0, 1 );
    return p;
}